

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifsub(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  int iVar2;
  runsdef *prVar3;
  ushort *puVar4;
  runcxdef *prVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x03') {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  prVar3 = prVar5->runcxsp;
  puVar4 = (ushort *)(prVar3->runsv).runsvstr;
  uVar1 = *puVar4;
  prVar5->runcxsp = prVar3 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar3[-1].runstyp == '\x01') {
    prVar3 = prVar5->runcxsp;
    iVar2 = *(int *)&prVar3->runsv;
    if (0 < iVar2) {
      prVar5->runcxsp = prVar3 + -1;
      prVar5 = ctx->bifcxrun;
      if (prVar3[-1].runstyp != '\x01') goto LAB_0020ccbc;
      iVar6 = *(int *)&prVar5->runcxsp->runsv;
      if (-1 < iVar6) {
        iVar7 = uVar1 - 2;
        iVar8 = iVar7 - (iVar2 - 1U);
        if (iVar6 <= iVar8) {
          iVar8 = iVar6;
        }
        iVar6 = 0;
        if (iVar2 <= iVar7) {
          iVar6 = iVar8;
        }
        runpstr(prVar5,(char *)((long)puVar4 + (ulong)(iVar2 - 1U) + 2),iVar6,3);
        return;
      }
    }
    prVar5->runcxerr->errcxptr->erraav[0].errastr = "substr";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
LAB_0020ccbc:
  prVar5->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void bifsub(bifcxdef *ctx, int argc)
{
    uchar   *p;
    int      ofs;
    int      asklen;
    int      outlen;
    int      len;

    bifcntargs(ctx, 3, argc);

    /* get the string argument */
    bifchkarg(ctx, DAT_SSTRING);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    /* get the offset argument */
    bifchkarg(ctx, DAT_NUMBER);
    ofs = runpopnum(ctx->bifcxrun);
    if (ofs < 1) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "substr");
    
    /* get the length argument */
    bifchkarg(ctx, DAT_NUMBER);
    asklen = runpopnum(ctx->bifcxrun);
    if (asklen < 0) runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "substr");

    --ofs;          /* convert offset to a zero bias (user provided 1-bias) */
    p += ofs;                           /* advance string pointer by offset */

    if (ofs >= len)
        outlen = 0;                         /* offset is past end of string */
    else if (asklen > len - ofs)
        outlen = len - ofs;                      /* just use rest of string */
    else
        outlen = asklen;                /* requested length can be provided */
    
    runpstr(ctx->bifcxrun, (char *)p, outlen, 3);
}